

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

void monster_index_move(chunk *c,wchar_t i1,wchar_t i2)

{
  loc grid;
  _Bool _Var1;
  monster *pmVar2;
  object *poVar3;
  monster *pmVar4;
  
  if (i1 != i2) {
    pmVar2 = cave_monster((chunk_conflict *)c,i1);
    if (pmVar2 != (monster *)0x0) {
      grid.x = (pmVar2->grid).x;
      grid.y = (pmVar2->grid).y;
      square_set_mon((chunk_conflict *)c,grid,i2);
      pmVar2->midx = i2;
      _Var1 = monster_group_change_index((chunk_conflict *)c,i2,i1);
      if (!_Var1) {
        quit("Bad monster group info!");
        monster_groups_verify((chunk_conflict *)c);
      }
      for (poVar3 = pmVar2->held_obj; poVar3 != (object *)0x0; poVar3 = poVar3->next) {
        poVar3->held_m_idx = (int16_t)i2;
      }
      if (pmVar2->mimicked_obj != (object *)0x0) {
        pmVar2->mimicked_obj->mimicking_m_idx = (int16_t)i2;
      }
      pmVar4 = target_get_monster();
      if (pmVar4 == pmVar2) {
        pmVar4 = cave_monster((chunk_conflict *)c,i2);
        target_set_monster(pmVar4);
      }
      if (player->upkeep->health_who == pmVar2) {
        pmVar2 = cave_monster((chunk_conflict *)c,i2);
        player->upkeep->health_who = pmVar2;
      }
      pmVar2 = cave_monster((chunk_conflict *)c,i2);
      pmVar4 = cave_monster((chunk_conflict *)c,i1);
      memcpy(pmVar2,pmVar4,0x1f0);
      pmVar2 = cave_monster((chunk_conflict *)c,i1);
      memset(pmVar2,0,0x1f0);
      return;
    }
  }
  return;
}

Assistant:

void monster_index_move(struct chunk *c, int i1, int i2)
{
	struct monster *mon;
	struct object *obj;

	/* Do nothing */
	if (i1 == i2) return;

	/* Old monster */
	mon = cave_monster(c, i1);
	if (!mon) return;

	/* Update the cave */
	square_set_mon(c, mon->grid, i2);

	/* Update midx */
	mon->midx = i2;

	/* Update group */
	if (!monster_group_change_index(c, i2, i1)) {
		quit("Bad monster group info!") ;
		monster_groups_verify(c);
	}

	/* Repair objects being carried by monster */
	for (obj = mon->held_obj; obj; obj = obj->next)
		obj->held_m_idx = i2;

	/* Move mimicked objects (heh) */
	if (mon->mimicked_obj)
		mon->mimicked_obj->mimicking_m_idx = i2;

	/* Update the target */
	if (target_get_monster() == mon)
		target_set_monster(cave_monster(c, i2));

	/* Update the health bar */
	if (player->upkeep->health_who == mon)
		player->upkeep->health_who = cave_monster(c, i2);

	/* Move monster */
	memcpy(cave_monster(c, i2),
			cave_monster(c, i1),
			sizeof(struct monster));

	/* Wipe hole */
	memset(cave_monster(c, i1), 0, sizeof(struct monster));
}